

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureLayerAttachmentTest::Test
          (TextureLayerAttachmentTest *this,GLenum attachment,bool is_color_attachment,
          GLenum texture_target,GLenum internalformat,GLuint levels,GLint layers)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  uint uVar6;
  GLuint level;
  undefined4 extraout_var;
  long lVar8;
  uint uVar9;
  uint layer;
  bool bVar10;
  double dVar11;
  double dVar12;
  long lVar7;
  undefined4 extraout_var_00;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar7 + 0x6f8))(1,&this->m_to);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x396);
  (**(code **)(lVar7 + 0xb8))(texture_target,this->m_to);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x399);
  dVar11 = (double)levels;
  if (texture_target == 0x9102) {
    pcVar1 = *(code **)(lVar7 + 0x13a8);
    dVar12 = exp2(dVar11);
    dVar11 = exp2(dVar11);
    (*pcVar1)(0x9102,1,internalformat,(long)dVar12 & 0xffffffff,(long)dVar11,layers,0);
    iVar3 = 0x39f;
  }
  else {
    pcVar1 = *(code **)(lVar7 + 0x1398);
    dVar12 = exp2(dVar11);
    dVar11 = exp2(dVar11);
    (*pcVar1)(texture_target,levels,internalformat,(long)dVar12 & 0xffffffff,(long)dVar11,layers);
    iVar3 = 0x3a5;
  }
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glRenderbufferStorage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,iVar3);
  level = 0;
  (**(code **)(lVar7 + 0xb8))(texture_target,0);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBindRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x3a9);
  (**(code **)(lVar7 + 0x3c0))(1);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glCreateFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x3ad);
  if (levels != 0) {
    bVar10 = false;
    do {
      uVar5 = layers;
      if (texture_target == 0x806f) {
        dVar11 = exp2((double)level);
        uVar5 = layers / (int)dVar11;
        if (layers < layers / (int)dVar11) {
          uVar5 = layers;
        }
      }
      if (uVar5 != 0) {
        uVar9 = 1;
        layer = 0;
        do {
          (**(code **)(lVar7 + 0xf40))(this->m_fbo,attachment,this->m_to,level,layer);
          bVar2 = SubTestAttachmentError(this,attachment,texture_target,level,layer,levels,layers);
          if (!bVar2) {
            return bVar10;
          }
          (**(code **)(lVar7 + 0x78))(0x8d40,this->m_fbo);
          dVar4 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar4,"glBindFramebuffer has failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                          ,0x3c4);
          if (is_color_attachment) {
            (**(code **)(lVar7 + 0x558))(attachment);
            dVar4 = (**(code **)(lVar7 + 0x800))();
            glu::checkError(dVar4,"glDrawBuffer has failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                            ,0x3c9);
            (**(code **)(lVar7 + 0x1218))(attachment);
            dVar4 = (**(code **)(lVar7 + 0x800))();
            glu::checkError(dVar4,"glReadBuffer has failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                            ,0x3cc);
          }
          bVar2 = SubTestStatus(this,attachment,texture_target,level,layer,levels,layers);
          if (!bVar2) {
            return bVar10;
          }
          if (texture_target != 0x9102) {
            iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
            lVar8 = CONCAT44(extraout_var_00,iVar3);
            (**(code **)(lVar8 + 0x1c0))(0x3e800000,0x3f000000,0x3f400000,0x3f800000);
            (**(code **)(lVar8 + 0x1c8))(0x3fe0000000000000);
            (**(code **)(lVar8 + 0x208))(7);
            (**(code **)(lVar8 + 0x188))(0x4500);
            bVar2 = SubTestContent(this,attachment,texture_target,internalformat,level,layer,levels,
                                   layers);
            if (!bVar2) {
              return bVar10;
            }
          }
          (**(code **)(lVar7 + 0x78))(0x8d40,0);
          dVar4 = (**(code **)(lVar7 + 0x800))();
          glu::checkError(dVar4,"glBindFramebuffer has failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                          ,0x3df);
          uVar6 = uVar9 + layer;
          uVar9 = layer;
          layer = uVar6;
        } while (uVar6 < uVar5);
      }
      level = level + 1;
      bVar10 = levels <= level;
    } while (level != levels);
  }
  return true;
}

Assistant:

bool TextureLayerAttachmentTest::Test(glw::GLenum attachment, bool is_color_attachment, glw::GLenum texture_target,
									  glw::GLenum internalformat, glw::GLuint levels, glw::GLint layers)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* RBO creation. */
	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(texture_target, m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	if (GL_TEXTURE_2D_MULTISAMPLE_ARRAY == texture_target)
	{
		gl.texStorage3DMultisample(texture_target, 1, internalformat, (glw::GLuint)std::pow((double)2, (double)levels),
								   (glw::GLuint)std::pow((double)2, (double)levels), layers, GL_FALSE);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");
	}
	else
	{
		gl.texStorage3D(texture_target, levels, internalformat, (glw::GLuint)std::pow((double)2, (double)levels),
						(glw::GLuint)std::pow((double)2, (double)levels), layers);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");
	}

	gl.bindTexture(texture_target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

	/* FBO creation. */
	gl.createFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateFramebuffers has failed");

	for (glw::GLuint i = 0; i < levels; ++i)
	{
		glw::GLuint j = 0;
		glw::GLuint k = 1;

		/* 3D textures are mipmapped also in depth directio, so number of layers to be tested must be limited. */
		glw::GLuint layers_at_level = (GL_TEXTURE_3D == texture_target) ?
										  (de::min(layers, layers / (glw::GLint)std::pow(2.0, (double)i))) :
										  layers;

		while (j < layers_at_level) /* Only layers with Fibonacci number index are tested to reduce the test time. */
		{
			/* Attach texture layer. */
			gl.namedFramebufferTextureLayer(m_fbo, attachment, m_to, i, j);

			if (!SubTestAttachmentError(attachment, texture_target, i, j, levels, layers))
			{
				return false;
			}

			gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

			if (is_color_attachment)
			{
				gl.drawBuffer(attachment);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffer has failed");

				gl.readBuffer(attachment);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glReadBuffer has failed");
			}

			if (!SubTestStatus(attachment, texture_target, i, j, levels, layers))
			{
				return false;
			}

			if (GL_TEXTURE_2D_MULTISAMPLE_ARRAY != texture_target)
			{
				Clear();

				if (!SubTestContent(attachment, texture_target, internalformat, i, j, levels, layers))
				{
					return false;
				}
			}

			gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

			/* Fibonacci number iteration. */
			int l = j;
			j	 = j + k;
			k	 = l;
		}
	}

	return true;
}